

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

Vec_Int_t * Abc_NtkFinComputeObjects(Vec_Int_t *vPairs,Vec_Wec_t **pvMap,int nObjs)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Wec_t *pVVar2;
  Vec_Int_t *vObjs;
  int Type;
  int iObj;
  int i;
  int nObjs_local;
  Vec_Wec_t **pvMap_local;
  Vec_Int_t *vPairs_local;
  
  p = Vec_IntAlloc(100);
  pVVar2 = Vec_WecStart(nObjs);
  *pvMap = pVVar2;
  for (Type = 2; iVar1 = Vec_IntSize(vPairs), Type + 1 < iVar1; Type = Type + 2) {
    iVar1 = Vec_IntEntry(vPairs,Type);
    Vec_IntEntry(vPairs,Type + 1);
    Vec_IntPush(p,iVar1);
    Vec_WecPush(*pvMap,iVar1,Type / 2);
  }
  Vec_IntUniqify(p);
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkFinComputeObjects( Vec_Int_t * vPairs, Vec_Wec_t ** pvMap, int nObjs )
{
    int i, iObj, Type;
    Vec_Int_t * vObjs = Vec_IntAlloc( 100 );
    *pvMap = Vec_WecStart( nObjs );
    Vec_IntForEachEntryDoubleStart( vPairs, iObj, Type, i, 2 )
    {
        Vec_IntPush( vObjs, iObj );
        Vec_WecPush( *pvMap, iObj, i/2 );
    }
    Vec_IntUniqify( vObjs );
    return vObjs;
}